

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlSetObjectString(JlDataObject *StringObject,char *String)

{
  JL_STATUS JVar1;
  char *pcVar2;
  
  if (StringObject != (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_WRONG_TYPE;
    if (StringObject->Type == JL_DATA_TYPE_STRING) {
      if ((StringObject->field_2).String != (char *)0x0) {
        WjTestLib_Free((StringObject->field_2).String);
        (StringObject->field_2).String = (char *)0x0;
      }
      JVar1 = JL_STATUS_SUCCESS;
      if ((String != (char *)0x0) && (JVar1 = JL_STATUS_SUCCESS, *String != '\0')) {
        pcVar2 = JlStrDup(String);
        (StringObject->field_2).String = pcVar2;
        JVar1 = (uint)(pcVar2 != (char *)0x0) * 2 + JL_STATUS_OUT_OF_MEMORY;
      }
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlSetObjectString
    (
        JlDataObject*   StringObject,
        char const*     String
    )
{
    JL_STATUS jlStatus;

    if( NULL != StringObject )
    {
        if( JL_DATA_TYPE_STRING == StringObject->Type )
        {
            if( NULL != StringObject->String )
            {
                // Remove existing string
                JlFree( StringObject->String );
                StringObject->String = NULL;
            }

            size_t length = 0;
            if( NULL != String )
            {
                length = strlen( String );
            }

            if( length > 0 )
            {
                // Only create a buffer if there is data. No need to just store a Zero terminator.
                StringObject->String = JlStrDup( String );
                if( NULL != StringObject->String )
                {
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    jlStatus = JL_STATUS_OUT_OF_MEMORY;
                }
            }
            else
            {
                // Nothing more to do.
                jlStatus = JL_STATUS_SUCCESS;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}